

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O0

Abc_Obj_t * Abc_NtkBddMux413(Abc_Ntk_t *pNtkNew,Abc_Obj_t **pFanins)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *local_58;
  Abc_Obj_t *pNodesTop [3];
  Abc_Obj_t *local_38;
  Abc_Obj_t *pNodesBot [3];
  Abc_Obj_t **pFanins_local;
  Abc_Ntk_t *pNtkNew_local;
  
  local_38 = pFanins[1];
  pNodesBot[0] = pFanins[2];
  pNodesBot[1] = pFanins[3];
  pNodesTop[0] = Abc_NtkBddMux21(pNtkNew,&local_38);
  local_38 = pFanins[1];
  pNodesBot[0] = pFanins[4];
  pNodesBot[1] = pFanins[5];
  pNodesTop[1] = Abc_NtkBddMux21(pNtkNew,&local_38);
  local_58 = *pFanins;
  pAVar1 = Abc_NtkBddMux21(pNtkNew,&local_58);
  return pAVar1;
}

Assistant:

Abc_Obj_t * Abc_NtkBddMux413( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pFanins[] )
{
    Abc_Obj_t * pNodesBot[3], * pNodesTop[3];
    // left bottom
    pNodesBot[0] = pFanins[1];
    pNodesBot[1] = pFanins[2];
    pNodesBot[2] = pFanins[3];
    pNodesTop[1] = Abc_NtkBddMux21( pNtkNew, pNodesBot );
    // right bottom
    pNodesBot[0] = pFanins[1];
    pNodesBot[1] = pFanins[4];
    pNodesBot[2] = pFanins[5];
    pNodesTop[2] = Abc_NtkBddMux21( pNtkNew, pNodesBot );
    // top node
    pNodesTop[0] = pFanins[0];
    return Abc_NtkBddMux21( pNtkNew, pNodesTop );
}